

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_sqr.c
# Opt level: O0

void bn_sqr_normal(unsigned_long *r,unsigned_long *a,int n,unsigned_long *tmp)

{
  int num;
  ulong uVar1;
  ulong *in_RCX;
  int in_EDX;
  ulong *in_RSI;
  ulong *in_RDI;
  unsigned_long *rp;
  unsigned_long *ap;
  int max;
  int j;
  int i;
  ulong *local_40;
  ulong *local_38;
  int local_28;
  int local_24;
  
  num = in_EDX * 2;
  in_RDI[num + -1] = 0;
  *in_RDI = 0;
  local_40 = in_RDI + 1;
  local_28 = in_EDX + -1;
  local_38 = in_RSI;
  if (0 < local_28) {
    local_38 = in_RSI + 1;
    uVar1 = bn_mul_words(local_40,local_38,local_28,*in_RSI);
    local_40[local_28] = uVar1;
    local_40 = in_RDI + 3;
  }
  for (local_24 = in_EDX + -2; 0 < local_24; local_24 = local_24 + -1) {
    local_28 = local_28 + -1;
    uVar1 = bn_mul_add_words(local_40,local_38 + 1,local_28,*local_38);
    local_40[local_28] = uVar1;
    local_40 = local_40 + 2;
    local_38 = local_38 + 1;
  }
  bn_add_words(in_RDI,in_RDI,in_RDI,num);
  bn_sqr_words(in_RCX,in_RSI,in_EDX);
  bn_add_words(in_RDI,in_RDI,in_RCX,num);
  return;
}

Assistant:

void bn_sqr_normal(BN_ULONG *r, const BN_ULONG *a, int n, BN_ULONG *tmp)
{
    int i, j, max;
    const BN_ULONG *ap;
    BN_ULONG *rp;

    max = n * 2;
    ap = a;
    rp = r;
    rp[0] = rp[max - 1] = 0;
    rp++;
    j = n;

    if (--j > 0) {
        ap++;
        rp[j] = bn_mul_words(rp, ap, j, ap[-1]);
        rp += 2;
    }

    for (i = n - 2; i > 0; i--) {
        j--;
        ap++;
        rp[j] = bn_mul_add_words(rp, ap, j, ap[-1]);
        rp += 2;
    }

    bn_add_words(r, r, r, max);

    /* There will not be a carry */

    bn_sqr_words(tmp, a, n);

    bn_add_words(r, r, tmp, max);
}